

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>
wabt::MakeUnique<wabt::FuncImport>(void)

{
  FuncImport *this;
  __uniq_ptr_data<wabt::FuncImport,_std::default_delete<wabt::FuncImport>,_true,_true> in_RDI;
  string_view local_20;
  
  this = (FuncImport *)operator_new(0x158);
  string_view::string_view(&local_20);
  FuncImport::FuncImport(this,local_20);
  std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>::
  unique_ptr<std::default_delete<wabt::FuncImport>,void>
            ((unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>> *)
             in_RDI.super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
             .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl,this);
  return (__uniq_ptr_data<wabt::FuncImport,_std::default_delete<wabt::FuncImport>,_true,_true>)
         (tuple<wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>)
         in_RDI.super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t
         .super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
         super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}